

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fhandle.h
# Opt level: O0

int __thiscall filehandle::fh(filehandle *this)

{
  bool bVar1;
  runtime_error *this_00;
  element_type *peVar2;
  filehandle *this_local;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
  if (!bVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"no filehandle set");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  peVar2 = std::__shared_ptr_access<filehandle::ptr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<filehandle::ptr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  return peVar2->fh;
}

Assistant:

int fh() const {
        if (!_p) throw std::runtime_error("no filehandle set");
        return _p->fh;
    }